

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * jx9StreamOpenHandle(jx9_vm *pVm,jx9_io_stream *pStream,char *zFile,int iFlags,int use_include
                          ,jx9_value *pResource,int bPushInclude,int *pNew)

{
  sxi32 sVar1;
  undefined1 local_80 [8];
  SyBlob sWorker;
  SyString *pPath;
  char *pcStack_50;
  int rc;
  SyString sFile;
  void *pHandle;
  jx9_value *pResource_local;
  int use_include_local;
  int iFlags_local;
  char *zFile_local;
  jx9_io_stream *pStream_local;
  jx9_vm *pVm_local;
  
  sFile.nByte = 0;
  sFile._12_4_ = 0;
  if (pStream == (jx9_io_stream *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    pcStack_50 = zFile;
    sFile.zString._0_4_ = SyStrlen(zFile);
    if (use_include == 0) {
      pPath._4_4_ = (*pStream->xOpen)(zFile,iFlags,pResource,(void **)&sFile.nByte);
    }
    else {
      if (((*pcStack_50 == '/') ||
          (((1 < (sxu32)sFile.zString && (*pcStack_50 == '.')) && (pcStack_50[1] == '/')))) ||
         ((((2 < (sxu32)sFile.zString && (*pcStack_50 == '.')) && (pcStack_50[1] == '.')) &&
          (pcStack_50[2] == '/')))) {
        pPath._4_4_ = (*pStream->xOpen)(zFile,iFlags,pResource,(void **)&sFile.nByte);
      }
      else {
        SyBlobInit((SyBlob *)local_80,&pVm->sAllocator);
        SySetResetCursor(&pVm->aPaths);
        pPath._4_4_ = -2;
        while (sVar1 = SySetGetNextEntry(&pVm->aPaths,(void **)&sWorker.nFlags), sVar1 == 0) {
          SyBlobFormat((SyBlob *)local_80,"%z%c%z",sWorker._24_8_,0x2f,&stack0xffffffffffffffb0);
          sVar1 = SyBlobNullAppend((SyBlob *)local_80);
          if (sVar1 == 0) {
            pPath._4_4_ = (*pStream->xOpen)((char *)sWorker.pAllocator,iFlags,pResource,
                                            (void **)&sFile.nByte);
            if (pPath._4_4_ == 0) {
              if (bPushInclude != 0) {
                jx9VmPushFilePath(pVm,(char *)sWorker.pAllocator,(int)sWorker.pBlob,'\0',pNew);
              }
              break;
            }
            SyBlobReset((SyBlob *)local_80);
          }
        }
        SyBlobRelease((SyBlob *)local_80);
      }
      if ((pPath._4_4_ == 0) && (bPushInclude != 0)) {
        jx9VmPushFilePath(pVm,pcStack_50,(sxu32)sFile.zString,'\0',pNew);
      }
    }
    if (pPath._4_4_ == 0) {
      pVm_local = (jx9_vm *)sFile._8_8_;
    }
    else {
      pVm_local = (jx9_vm *)0x0;
    }
  }
  return pVm_local;
}

Assistant:

JX9_PRIVATE void * jx9StreamOpenHandle(jx9_vm *pVm, const jx9_io_stream *pStream, const char *zFile, 
	int iFlags, int use_include, jx9_value *pResource, int bPushInclude, int *pNew)
{
	void *pHandle = 0; /* cc warning */
	SyString sFile;
	int rc;
	if( pStream == 0 ){
		/* No such stream device */
		return 0;
	}
	SyStringInitFromBuf(&sFile, zFile, SyStrlen(zFile));
	if( use_include ){
		if(	sFile.zString[0] == '/' ||
#ifdef __WINNT__
			(sFile.nByte > 2 && sFile.zString[1] == ':' && (sFile.zString[2] == '\\' || sFile.zString[2] == '/') ) ||
#endif
			(sFile.nByte > 1 && sFile.zString[0] == '.' && sFile.zString[1] == '/') ||
			(sFile.nByte > 2 && sFile.zString[0] == '.' && sFile.zString[1] == '.' && sFile.zString[2] == '/') ){
				/*  Open the file directly */
				rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
		}else{
			SyString *pPath;
			SyBlob sWorker;
#ifdef __WINNT__
			static const int c = '\\';
#else
			static const int c = '/';
#endif
			/* Init the path builder working buffer */
			SyBlobInit(&sWorker, &pVm->sAllocator);
			/* Build a path from the set of include path */
			SySetResetCursor(&pVm->aPaths);
			rc = SXERR_IO;
			while( SXRET_OK == SySetGetNextEntry(&pVm->aPaths, (void **)&pPath) ){
				/* Build full path */
				SyBlobFormat(&sWorker, "%z%c%z", pPath, c, &sFile);
				/* Append null terminator */
				if( SXRET_OK != SyBlobNullAppend(&sWorker) ){
					continue;
				}
				/* Try to open the file */
				rc = pStream->xOpen((const char *)SyBlobData(&sWorker), iFlags, pResource, &pHandle);
				if( rc == JX9_OK ){
					if( bPushInclude ){
						/* Mark as included */
						jx9VmPushFilePath(pVm, (const char *)SyBlobData(&sWorker), SyBlobLength(&sWorker), FALSE, pNew);
					}
					break;
				}
				/* Reset the working buffer */
				SyBlobReset(&sWorker);
				/* Check the next path */
			}
			SyBlobRelease(&sWorker);
		}
		if( rc == JX9_OK ){
			if( bPushInclude ){
				/* Mark as included */
				jx9VmPushFilePath(pVm, sFile.zString, sFile.nByte, FALSE, pNew);
			}
		}
	}else{
		/* Open the URI direcly */
		rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
	}
	if( rc != JX9_OK ){
		/* IO error */
		return 0;
	}
	/* Return the file handle */
	return pHandle;
}